

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

int * __thiscall Item::operator[](Item *this,int i)

{
  runtime_error *this_00;
  reference pvVar1;
  char local_118 [8];
  char _error_msg_ [256];
  int i_local;
  Item *this_local;
  
  _error_msg_._252_4_ = i;
  if (this->ndims <= i) {
    snprintf(local_118,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d","i < ndims",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/instance.cpp"
             ,0x23);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,local_118);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&this->w,(long)i);
  return pvVar1;
}

Assistant:

int &Item::operator[](int i) {
	throw_assert(i < ndims);
	return w[i];
}